

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O2

ProfiledInstr * __thiscall IR::ProfiledInstr::CopyProfiledInstr(ProfiledInstr *this)

{
  ProfiledInstr *this_00;
  
  this_00 = (ProfiledInstr *)
            new<Memory::JitArenaAllocator>(0x60,((this->super_Instr).m_func)->m_alloc,0x3d6ef4);
  ProfiledInstr(this_00,false);
  Instr::Init((Instr *)this_00,(this->super_Instr).m_opcode,InstrKindProfiled,
              (this->super_Instr).m_func);
  this_00->u = this->u;
  return this_00;
}

Assistant:

ProfiledInstr *
ProfiledInstr::CopyProfiledInstr() const
{
    IR::ProfiledInstr * profiledInstr;

    profiledInstr = JitAnew(this->m_func->m_alloc, IR::ProfiledInstr);
    profiledInstr->Init(this->m_opcode, InstrKindProfiled, this->m_func);
    profiledInstr->u = this->u;

    return profiledInstr;
}